

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::setCommonBlendState(Functions *gl,BlendState *blend)

{
  bool *pbVar1;
  Vector<bool,_4> *pVVar2;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar3;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar4;
  BlendFunc *pBVar5;
  GLenum GVar6;
  BVec4 *mask;
  glDisableFunc *pp_Var7;
  
  pbVar1 = (blend->enableBlend).m_ptr;
  if (pbVar1 != (bool *)0x0) {
    pp_Var7 = &gl->disable;
    if (*pbVar1 != false) {
      pp_Var7 = &gl->enable;
    }
    (**pp_Var7)(0xbe2);
  }
  pVVar2 = (blend->colorMask).m_ptr;
  if (pVVar2 != (Vector<bool,_4> *)0x0) {
    (*gl->colorMask)(pVVar2->m_data[0],pVVar2->m_data[1],pVVar2->m_data[2],pVVar2->m_data[3]);
  }
  pEVar3 = (blend->blendEq).m_ptr;
  if (pEVar3 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    GVar6 = *(pEVar3->field_1).m_first;
    if (pEVar3->m_isFirst == true) {
      (*gl->blendEquation)(GVar6);
    }
    else {
      (*gl->blendEquationSeparate)(GVar6,(pEVar3->field_1).m_first[1]);
    }
  }
  pEVar4 = (blend->blendFunc).m_ptr;
  if (pEVar4 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    pBVar5 = (pEVar4->field_1).m_first;
    if (pEVar4->m_isFirst == true) {
      (*gl->blendFunc)(pBVar5->src,pBVar5->dst);
    }
    else {
      (*gl->blendFuncSeparate)(pBVar5->src,pBVar5->dst,pBVar5[1].src,pBVar5[1].dst);
    }
  }
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to set common blend state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0xe2);
  return;
}

Assistant:

void setCommonBlendState (const glw::Functions& gl, const BlendState& blend)
{
	if (blend.enableBlend)
	{
		if (*blend.enableBlend)
			gl.enable(GL_BLEND);
		else
			gl.disable(GL_BLEND);
	}

	if (blend.colorMask)
	{
		const BVec4& mask = *blend.colorMask;

		gl.colorMask(mask.x(), mask.y(), mask.z(), mask.w());
	}

	if (blend.blendEq)
	{
		const Either<BlendEq, SeparateBlendEq>& blendEq = *blend.blendEq;

		if (blendEq.is<BlendEq>())
			gl.blendEquation(blendEq.get<BlendEq>());
		else if (blendEq.is<SeparateBlendEq>())
			gl.blendEquationSeparate(blendEq.get<SeparateBlendEq>().rgb, blendEq.get<SeparateBlendEq>().alpha);
		else
			DE_ASSERT(false);
	}

	if (blend.blendFunc)
	{
		const Either<BlendFunc, SeparateBlendFunc>& blendFunc = *blend.blendFunc;

		if (blendFunc.is<BlendFunc>())
			gl.blendFunc(blendFunc.get<BlendFunc>().src, blendFunc.get<BlendFunc>().dst);
		else if (blendFunc.is<SeparateBlendFunc>())
			gl.blendFuncSeparate(blendFunc.get<SeparateBlendFunc>().rgb.src, blendFunc.get<SeparateBlendFunc>().rgb.dst, blendFunc.get<SeparateBlendFunc>().alpha.src, blendFunc.get<SeparateBlendFunc>().alpha.dst);
		else
			DE_ASSERT(false);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set common blend state.");
}